

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

void google::SafeAppendString(char *source,char *dest,int dest_size)

{
  int iVar1;
  size_t sVar2;
  int dest_string_length;
  int dest_size_local;
  char *dest_local;
  char *source_local;
  
  sVar2 = strlen(dest);
  iVar1 = (int)sVar2;
  if (dest_size <= iVar1) {
    AssertFail();
  }
  strncpy(dest + iVar1,source,(long)(dest_size - iVar1));
  (dest + iVar1)[(dest_size - iVar1) + -1] = '\0';
  return;
}

Assistant:

static void SafeAppendString(const char* source, char* dest, int dest_size) {
  int dest_string_length = strlen(dest);
  SAFE_ASSERT(dest_string_length < dest_size);
  dest += dest_string_length;
  dest_size -= dest_string_length;
  strncpy(dest, source, dest_size);
  // Making sure |dest| is always null-terminated.
  dest[dest_size - 1] = '\0';
}